

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

bool Imf_3_4::anon_unknown_0::runCoreChecks
               (char *data,size_t numBytes,bool reduceMemory,bool reduceTime)

{
  ulong uVar1;
  undefined8 uVar2;
  bool reduceTime_00;
  bool reduceMemory_00;
  byte in_CL;
  byte in_DL;
  exr_context_t in_RSI;
  undefined8 in_RDI;
  memdata md;
  exr_context_initializer_t cinit;
  exr_context_t f;
  exr_result_t rv;
  bool hadfail;
  undefined1 local_a0 [6];
  undefined8 local_90;
  code *local_88;
  undefined1 *local_70;
  code *local_68;
  code *local_60;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 local_28 [8];
  int local_20;
  byte local_1b;
  byte local_1a;
  byte local_19;
  exr_context_t local_18;
  undefined8 local_10;
  bool local_1;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  local_1b = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_90,0,0x68);
  local_90 = 0x68;
  local_38 = 0xfffffffe;
  local_34 = 0xbf800000;
  _local_a0 = local_10;
  local_70 = local_a0;
  local_68 = memstream_read;
  local_60 = memstream_size;
  local_88 = core_error_handler_cb;
  if (((local_19 & 1) != 0) || ((local_1a & 1) != 0)) {
    local_48 = 0x800;
    local_44 = 0x800;
    local_40 = 0x200;
    local_3c = 0x200;
  }
  local_20 = exr_start_read(local_28,"<memstream>",&local_90);
  uVar2 = _local_a0;
  if (local_20 == 0) {
    uVar1 = (ulong)_local_a0 >> 0x38;
    reduceMemory_00 = SUB81(uVar1,0);
    reduceTime_00 = SUB81((ulong)uVar2 >> 0x30,0);
    _local_a0 = uVar2;
    local_1b = checkCoreFile(local_18,reduceMemory_00,reduceTime_00);
    exr_finish(local_28);
    local_1 = (bool)(local_1b & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
runCoreChecks (
    const char* data, size_t numBytes, bool reduceMemory, bool reduceTime)
{
    bool                      hadfail = false;
    exr_result_t              rv;
    exr_context_t             f;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    memdata                   md;

    md.data  = data;
    md.bytes = numBytes;

    cinit.user_data        = &md;
    cinit.read_fn          = &memstream_read;
    cinit.size_fn          = &memstream_size;
    cinit.error_handler_fn = &core_error_handler_cb;
    if (reduceMemory || reduceTime)
    {
        /* could use set_default functions for this, but those just
         * initialize the context, doing it in the initializer is mt
         * safe...
         * exr_set_default_maximum_image_size (2048, 2048);
         * exr_set_default_maximum_tile_size (512, 512);
         */
        cinit.max_image_width  = 2048;
        cinit.max_image_height = 2048;
        cinit.max_tile_width   = 512;
        cinit.max_tile_height  = 512;
    }

    rv = exr_start_read (&f, "<memstream>", &cinit);
    if (rv != EXR_ERR_SUCCESS) return true;

    hadfail = checkCoreFile (f, reduceMemory, reduceTime);

    exr_finish (&f);

    return hadfail;
}